

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O3

void __thiscall
icu_63::FieldPositionIterator::setData
          (FieldPositionIterator *this,UVector32 *adopt,UErrorCode *status)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int32_t iVar4;
  
  if (adopt != (UVector32 *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = adopt->count;
    if ((ulong)uVar1 == 0) {
      (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      adopt = (UVector32 *)0x0;
      goto LAB_0024977b;
    }
    if (0x55555554 < uVar1 * -0x55555555 + 0x2aaaaaaa) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_0024976d;
    }
    if ((int)uVar1 < 2) goto LAB_0024977b;
    uVar3 = 2;
    do {
      iVar4 = 0;
      if (uVar3 < uVar1) {
        iVar4 = adopt->elements[uVar3];
      }
      if (iVar4 <= adopt->elements[uVar3 - 1]) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_00249768;
      }
      iVar2 = (int)uVar3;
      uVar3 = uVar3 + 3;
    } while (iVar2 + 2 < (int)uVar1);
  }
  if (U_ZERO_ERROR < *status) {
LAB_00249768:
    if (adopt == (UVector32 *)0x0) {
      return;
    }
LAB_0024976d:
    (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
    return;
  }
LAB_0024977b:
  if (this->data != (UVector32 *)0x0) {
    (*(this->data->super_UObject)._vptr_UObject[1])();
  }
  this->data = adopt;
  this->pos = -(uint)(adopt == (UVector32 *)0x0);
  return;
}

Assistant:

void FieldPositionIterator::setData(UVector32 *adopt, UErrorCode& status) {
  // Verify that adopt has valid data, and update status if it doesn't.
  if (U_SUCCESS(status)) {
    if (adopt) {
      if (adopt->size() == 0) {
        delete adopt;
        adopt = NULL;
      } else if ((adopt->size() % 3) != 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
      } else {
        for (int i = 1; i < adopt->size(); i += 3) {
          if (adopt->elementAti(i) >= adopt->elementAti(i+1)) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
        }
      }
    }
  }

  // We own the data, even if status is in error, so we need to delete it now
  // if we're not keeping track of it.
  if (!U_SUCCESS(status)) {
    delete adopt;
    return;
  }

  delete data;
  data = adopt;
  pos = adopt == NULL ? -1 : 0;
}